

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O2

void __thiscall KktChStep::printA(KktChStep *this)

{
  char *__s;
  pointer piVar1;
  undefined8 in_RAX;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  int j;
  int i;
  long lVar5;
  ulong uVar6;
  char buff [4];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::operator<<((ostream *)&std::cout,"\n-----cost-----\n");
  __s = (char *)((long)&uStack_38 + 4);
  for (lVar5 = 0; lVar5 < this->numCol; lVar5 = lVar5 + 1) {
    sprintf(__s,"%2.1g ",
            (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5]);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
    std::operator<<((ostream *)&std::cout,__s);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"------A-|-b-----\n");
  uVar6 = 0;
  do {
    if ((long)this->numRow <= (long)uVar6) {
      std::operator<<((ostream *)&std::cout,"------l------\n");
      for (lVar5 = 0; lVar5 < this->numCol; lVar5 = lVar5 + 1) {
        if ((this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] <= -1e+200) {
          uStack_38 = CONCAT44(0x666e692d,(undefined4)uStack_38);
        }
        else {
          sprintf((char *)((long)&uStack_38 + 4),"%2.1g ");
        }
        *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
        std::operator<<((ostream *)&std::cout,(char *)((long)&uStack_38 + 4));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::operator<<((ostream *)&std::cout,"------u------\n");
      for (lVar5 = 0; lVar5 < this->numCol; lVar5 = lVar5 + 1) {
        if (1e+200 <= (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5]) {
          uStack_38 = CONCAT44(0x666e69,(undefined4)uStack_38);
        }
        else {
          sprintf((char *)((long)&uStack_38 + 4),"%2.1g ");
        }
        *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
        std::operator<<((ostream *)&std::cout,(char *)((long)&uStack_38 + 4));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      return;
    }
    for (lVar5 = 0; lVar5 < this->numCol; lVar5 = lVar5 + 1) {
      piVar1 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar2 = (long)piVar1[lVar5];
          uVar6 != (uint)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar2]; lVar2 = lVar2 + 1) {
        if (piVar1[lVar5 + 1] <= lVar2) {
          pcVar4 = "   ";
          goto LAB_00150437;
        }
      }
      pcVar4 = "   ";
      if ((int)lVar2 < piVar1[lVar5 + 1]) {
        sprintf(__s,"%2.1g ",
                (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar2]);
        pcVar4 = __s;
      }
LAB_00150437:
      *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
      std::operator<<((ostream *)&std::cout,pcVar4);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"  |   ");
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 5;
    poVar3 = std::ostream::_M_insert<double>
                       ((this->RrowLower).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar6]);
    std::operator<<(poVar3," < < ");
    poVar3 = std::ostream::_M_insert<double>
                       ((this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar6]);
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void KktChStep::printA() {
	char buff [4];
	cout<<"\n-----cost-----\n";

	for (int i=0;i<numCol;i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------A-|-b-----\n";
	for (int i=0;i<numRow;i++) {
		for (int j=0;j<numCol;j++) {

			int ind = Astart[j];
			while (Aindex[ind]!=i && ind<Astart[j+1]) 
				ind++;
			//if a_ij is nonzero print
			if (Aindex[ind]==i && ind<Astart[j+1])
			{	
				sprintf(buff, "%2.1g ", Avalue[ind]);
				cout<<std::setw(5)<<buff; 
				}
			else cout<<std::setw(5)<<"   ";
			
		}
		cout<<"  |   "<<std::setw(5)<<RrowLower[i]<<" < < "<<RrowUpper[i]<<endl;
	}
	cout<<"------l------\n";
	for (int i=0;i<numCol;i++) {
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else 
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------u------\n";
	for (int i=0;i<numCol;i++) {
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else 
			sprintf(buff, "inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;

}